

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

void fight_prog_skean(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *pCVar4;
  AFFECT_DATA af;
  
  bVar1 = is_worn(obj);
  if (!bVar1) {
    return;
  }
  iVar2 = number_percent();
  if (iVar2 < 6) {
    number_percent();
    pCVar4 = char_data::Class(ch->fighting);
    if ((pCVar4->ctype != 2) || (bVar1 = is_affected(ch->fighting,(int)gsn_severed), bVar1)) {
      if ((ch->affected_by[0] & 1) != 0) {
        bVar1 = is_good(ch->fighting);
        if (!bVar1) {
          return;
        }
        act("You swoon for a moment, and the world goes slightly hazy...",ch->fighting,(void *)0x0,
            (void *)0x0,3);
        WAIT_STATE(ch->fighting,0x18);
        return;
      }
      act("An enchanted obsidian skean darts toward your eyes, gouging you painfully!",ch,
          (void *)0x0,ch->fighting,2);
      act("An enchanted obsidian skean darts toward $N\'s eyes, gouging $M painfully!",ch,
          (void *)0x0,ch->fighting,1);
      init_affect(&af);
      af.where = 0;
      af.aftype = 1;
      af.level = ch->level;
      af.type = gsn_bleeding;
      af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
      iVar2 = 4;
    }
    else {
      act("An enchanted obsidian skean blazes through the air, leaving a trail of fire!",ch,
          (void *)0x0,ch->fighting,0);
      iVar2 = 2;
      act("Your vital ties to the gods\' empowerment have been severed!",ch,(void *)0x0,ch->fighting
          ,2);
      init_affect(&af);
      af.where = 0;
      af.aftype = 1;
      af.type = gsn_severed;
      af.level = ch->level;
      iVar3 = dice(1,8);
      af.modifier = (short)iVar3 + 10;
    }
    iVar2 = dice(1,iVar2);
    af.duration = (short)iVar2;
    new_affect_to_char(ch->fighting,&af);
    return;
  }
  return;
}

Assistant:

void fight_prog_skean(OBJ_DATA *obj, CHAR_DATA *ch)
{
	int percent;
	AFFECT_DATA af;

	if (!is_worn(obj))
		return;

	if (number_percent() < 6)
	{
		percent = number_percent();
		if (ch->fighting->Class()->ctype == CLASS_COMMUNER && !is_affected(ch->fighting, gsn_severed))
		{
			act("An enchanted obsidian skean blazes through the air, leaving a trail of fire!", ch, 0, ch->fighting, TO_ROOM);
			act("Your vital ties to the gods' empowerment have been severed!", ch, 0, ch->fighting, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.type = gsn_severed;
			af.level = ch->level;
			af.modifier = 10 + dice(1, 8);
			af.duration = dice(1, 2);
			new_affect_to_char(ch->fighting, &af);

			return;
		}

		if (!IS_SET(ch->affected_by, AFF_BLIND))
		{
			act("An enchanted obsidian skean darts toward your eyes, gouging you painfully!", ch, 0, ch->fighting, TO_VICT);
			act("An enchanted obsidian skean darts toward $N's eyes, gouging $M painfully!", ch, 0, ch->fighting, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.level = ch->level;
			af.type = gsn_bleeding;

			SET_BIT(af.bitvector, AFF_BLIND);
			af.duration = dice(1, 4);
			new_affect_to_char(ch->fighting, &af);

			return;
		}

		if (is_good(ch->fighting))
		{
			act("You swoon for a moment, and the world goes slightly hazy...", ch->fighting, 0, 0, TO_CHAR);
			WAIT_STATE(ch->fighting, PULSE_VIOLENCE * 2);
			return;
		}
	}
}